

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<15UL> mserialize::cx_strcat<15ul>(cx_string<15UL> *strings)

{
  char *pcVar1;
  bool bVar2;
  size_t s;
  long lVar3;
  char buffer [16];
  char local_28 [16];
  cx_string<15UL> local_18;
  
  pcVar1 = local_28;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  bVar2 = true;
  while (bVar2) {
    for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
      pcVar1[lVar3] = strings->_data[lVar3];
    }
    pcVar1 = pcVar1 + 0xf;
    bVar2 = false;
  }
  cx_string<15UL>::cx_string(&local_18,local_28);
  return (cx_string<15UL>)local_18._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}